

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transreg.cpp
# Opt level: O1

TransliteratorEntry *
icu_63::TransliteratorRegistry::findInBundle
          (TransliteratorSpec *specToOpen,TransliteratorSpec *specToFind,UnicodeString *variant,
          UTransDirection direction)

{
  short sVar1;
  ushort uVar2;
  UChar *srcChars;
  UBool UVar3;
  int iVar4;
  UTransDirection UVar5;
  UnicodeString *src;
  CharString *pCVar6;
  Locale *pLVar7;
  TransliteratorEntry *pTVar8;
  undefined4 uVar9;
  uint uVar10;
  Locale *pLVar11;
  int32_t iVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  ResourceBundle subres;
  UnicodeString utag;
  UnicodeString s;
  UnicodeString resStr;
  UErrorCode local_284;
  TransliteratorSpec *local_280;
  UTransDirection local_274;
  ResourceBundle local_270;
  _func_int **local_258;
  UnicodeString *local_250;
  UChar *local_248;
  UnicodeString *local_240;
  ulong local_238;
  UChar *local_230;
  undefined1 *local_220;
  UnicodeString local_210;
  undefined1 local_1d0 [64];
  UnicodeString local_190;
  CharString local_150;
  Locale local_110;
  
  local_210.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_0048be70;
  local_210.fUnion.fStackFields.fLengthAndFlags = 2;
  local_258 = (_func_int **)&PTR__UnicodeString_0048be70;
  local_190.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_0048be70;
  local_190.fUnion.fStackFields.fLengthAndFlags = 2;
  local_248 = (UChar *)TRANSLITERATE_FROM;
  if (direction == UTRANS_FORWARD) {
    local_248 = (UChar *)TRANSLITERATE_TO;
  }
  local_240 = &specToFind->spec;
  local_250 = &specToOpen->spec;
  uVar14 = 0;
  local_280 = specToOpen;
  local_274 = direction;
  do {
    srcChars = local_248;
    if ((local_210.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
      uVar9 = local_210.fUnion.fFields.fLength;
      if (-1 < local_210.fUnion.fStackFields.fLengthAndFlags) {
        uVar9 = (int)local_210.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      if (uVar9 != 0) {
        local_210.fUnion.fStackFields.fLengthAndFlags =
             local_210.fUnion.fStackFields.fLengthAndFlags & 0x1e;
      }
    }
    else {
      icu_63::UnicodeString::unBogus(&local_210);
    }
    if ((int)uVar14 == 0) {
      icu_63::UnicodeString::doAppend(&local_210,srcChars,0,-1);
      local_230 = srcChars;
    }
    else {
      icu_63::UnicodeString::doAppend(&local_210,(UChar *)TRANSLITERATE,0,-1);
      local_220 = TRANSLITERATE;
    }
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_1d0,local_240);
    Locale::Locale(&local_110,"",(char *)0x0,(char *)0x0,(char *)0x0);
    src = icu_63::UnicodeString::toUpper((UnicodeString *)local_1d0,&local_110);
    sVar1 = (src->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar12 = (src->fUnion).fFields.fLength;
    }
    else {
      iVar12 = (int)sVar1 >> 5;
    }
    icu_63::UnicodeString::doAppend(&local_210,src,0,iVar12);
    local_238 = uVar14;
    Locale::~Locale(&local_110);
    local_284 = U_ZERO_ERROR;
    pLVar11 = (Locale *)local_280->res;
    MaybeStackArray<char,_40>::MaybeStackArray((MaybeStackArray<char,_40> *)&local_110);
    local_110.fullNameBuffer[8] = '\0';
    local_110.fullNameBuffer[9] = '\0';
    local_110.fullNameBuffer[10] = '\0';
    local_110.fullNameBuffer[0xb] = '\0';
    *(undefined1 *)local_110.super_UObject._vptr_UObject = 0;
    pCVar6 = CharString::appendInvariantChars((CharString *)&local_110,&local_210,&local_284);
    ResourceBundle::get(&local_270,(ResourceBundle *)pLVar11,(pCVar6->buffer).ptr,&local_284);
    MaybeStackArray<char,_40>::~MaybeStackArray((MaybeStackArray<char,_40> *)&local_110);
    iVar13 = (int)local_238;
    if (local_284 != U_USING_DEFAULT_WARNING && local_284 < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((local_1d0._8_2_ & 1) == 0) {
        iVar4 = local_1d0._12_4_;
        if (-1 < (short)local_1d0._8_2_) {
          iVar4 = (int)(short)local_1d0._8_2_ >> 5;
        }
        if (iVar4 != 0) {
          local_1d0._8_2_ = local_1d0._8_2_ & 0x1e;
        }
      }
      else {
        icu_63::UnicodeString::unBogus((UnicodeString *)local_1d0);
      }
      pLVar7 = ResourceBundle::getLocale(&local_270);
      pLVar11 = (Locale *)local_1d0;
      pLVar7 = (Locale *)LocaleUtility::initNameFromLocale(pLVar7,(UnicodeString *)local_1d0);
      uVar2 = (local_280->spec).fUnion.fStackFields.fLengthAndFlags;
      if ((uVar2 & 1) == 0) {
        if ((short)uVar2 < 0) {
          iVar4 = (local_280->spec).fUnion.fFields.fLength;
        }
        else {
          iVar4 = (int)(short)uVar2 >> 5;
        }
        sVar1 = (((StackBufferOrFields *)pLVar7->language)->fStackFields).fLengthAndFlags;
        uVar10 = (uint)sVar1;
        if (sVar1 < 0) {
          iVar12 = (((StackBufferOrFields *)pLVar7->language)->fFields).fLength;
        }
        else {
          iVar12 = (int)uVar10 >> 5;
        }
        pLVar11 = (Locale *)(ulong)uVar10;
        bVar15 = false;
        if (((uVar10 & 1) == 0) && (bVar15 = false, iVar4 == iVar12)) {
          UVar3 = icu_63::UnicodeString::doEquals(local_250,(UnicodeString *)pLVar7,iVar4);
          bVar15 = UVar3 != '\0';
          pLVar11 = pLVar7;
        }
      }
      else {
        bVar15 = (bool)(*(byte *)pLVar7->language & 1);
      }
      if (bVar15 != false) {
        sVar1 = (variant->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar4 = (variant->fUnion).fFields.fLength;
        }
        else {
          iVar4 = (int)sVar1 >> 5;
        }
        local_284 = U_ZERO_ERROR;
        pLVar11 = &local_110;
        if (iVar4 == 0) {
          ResourceBundle::getStringEx((UnicodeString *)&local_110,&local_270,1,&local_284);
          icu_63::UnicodeString::moveFrom(&local_190,(UnicodeString *)&local_110);
          icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_110);
        }
        else {
          MaybeStackArray<char,_40>::MaybeStackArray(&local_150.buffer);
          local_150.len = 0;
          *local_150.buffer.ptr = '\0';
          pCVar6 = CharString::appendInvariantChars(&local_150,variant,&local_284);
          ResourceBundle::getStringEx
                    ((UnicodeString *)&local_110,&local_270,(pCVar6->buffer).ptr,&local_284);
          icu_63::UnicodeString::moveFrom(&local_190,(UnicodeString *)&local_110);
          icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_110);
          MaybeStackArray<char,_40>::~MaybeStackArray(&local_150.buffer);
        }
        if (local_284 < U_ILLEGAL_ARGUMENT_ERROR) {
          ResourceBundle::~ResourceBundle(&local_270);
          icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_1d0);
          goto LAB_0027aa1b;
        }
      }
    }
    ResourceBundle::~ResourceBundle(&local_270);
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_1d0);
    uVar14 = (ulong)(iVar13 + 1U);
    if (iVar13 + 1U != 1) {
      iVar13 = 2;
LAB_0027aa1b:
      if (iVar13 == 2) {
        pTVar8 = (TransliteratorEntry *)0x0;
      }
      else {
        pTVar8 = (TransliteratorEntry *)UMemory::operator_new((UMemory *)0x68,(size_t)pLVar11);
        if (pTVar8 == (TransliteratorEntry *)0x0) {
          pTVar8 = (TransliteratorEntry *)0x0;
        }
        else {
          (pTVar8->stringArg).super_Replaceable.super_UObject._vptr_UObject = local_258;
          (pTVar8->stringArg).fUnion.fStackFields.fLengthAndFlags = 2;
          pTVar8->compoundFilter = (UnicodeSet *)0x0;
          (pTVar8->u).prototype = (Transliterator *)0x0;
          pTVar8->entryType = NONE;
        }
        if (pTVar8 != (TransliteratorEntry *)0x0) {
          pTVar8->entryType = LOCALE_RULES;
          icu_63::UnicodeString::operator=(&pTVar8->stringArg,&local_190);
          UVar5 = local_274;
          if (iVar13 == 0) {
            UVar5 = UTRANS_FORWARD;
          }
          pTVar8->intArg = UVar5;
        }
      }
      icu_63::UnicodeString::~UnicodeString(&local_190);
      icu_63::UnicodeString::~UnicodeString(&local_210);
      return pTVar8;
    }
  } while( true );
}

Assistant:

TransliteratorEntry* TransliteratorRegistry::findInBundle(const TransliteratorSpec& specToOpen,
                                            const TransliteratorSpec& specToFind,
                                            const UnicodeString& variant,
                                            UTransDirection direction)
{
    UnicodeString utag;
    UnicodeString resStr;
    int32_t pass;

    for (pass=0; pass<2; ++pass) {
        utag.truncate(0);
        // First try either TransliteratorTo_xxx or
        // TransliterateFrom_xxx, then try the bidirectional
        // Transliterate_xxx.  This precedence order is arbitrary
        // but must be consistent and documented.
        if (pass == 0) {
            utag.append(direction == UTRANS_FORWARD ?
                        TRANSLITERATE_TO : TRANSLITERATE_FROM, -1);
        } else {
            utag.append(TRANSLITERATE, -1);
        }
        UnicodeString s(specToFind.get());
        utag.append(s.toUpper(""));
        UErrorCode status = U_ZERO_ERROR;
        ResourceBundle subres(specToOpen.getBundle().get(
            CharString().appendInvariantChars(utag, status).data(), status));
        if (U_FAILURE(status) || status == U_USING_DEFAULT_WARNING) {
            continue;
        }

        s.truncate(0);
        if (specToOpen.get() != LocaleUtility::initNameFromLocale(subres.getLocale(), s)) {
            continue;
        }

        if (variant.length() != 0) {
            status = U_ZERO_ERROR;
            resStr = subres.getStringEx(
                CharString().appendInvariantChars(variant, status).data(), status);
            if (U_SUCCESS(status)) {
                // Exit loop successfully
                break;
            }
        } else {
            // Variant is empty, which means match the first variant listed.
            status = U_ZERO_ERROR;
            resStr = subres.getStringEx(1, status);
            if (U_SUCCESS(status)) {
                // Exit loop successfully
                break;
            }
        }
    }

    if (pass==2) {
        // Failed
        return NULL;
    }

    // We have succeeded in loading a string from the locale
    // resources.  Create a new registry entry to hold it and return it.
    TransliteratorEntry *entry = new TransliteratorEntry();
    if (entry != 0) {
        // The direction is always forward for the
        // TransliterateTo_xxx and TransliterateFrom_xxx
        // items; those are unidirectional forward rules.
        // For the bidirectional Transliterate_xxx items,
        // the direction is the value passed in to this
        // function.
        int32_t dir = (pass == 0) ? UTRANS_FORWARD : direction;
        entry->entryType = TransliteratorEntry::LOCALE_RULES;
        entry->stringArg = resStr;
        entry->intArg = dir;
    }

    return entry;
}